

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VIP.cpp
# Opt level: O0

void iniVIP(void)

{
  bool bVar1;
  long *plVar2;
  int local_5e0;
  int local_5dc;
  int j;
  int i;
  stringstream ss;
  string local_450 [8];
  string s;
  char local_430 [8];
  ifstream fin;
  char local_215;
  int local_214;
  char local_210 [3];
  char a;
  int num;
  ifstream test;
  
  std::ifstream::ifstream(local_210,"VIPlist.txt",8);
  while( true ) {
    plVar2 = (long *)std::istream::get(local_210);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    if (local_215 == '\n') {
      local_214 = local_214 + 1;
    }
  }
  std::ifstream::ifstream(local_430,"VIPlist.txt",8);
  std::__cxx11::string::string(local_450);
  std::__cxx11::stringstream::stringstream((stringstream *)&j);
  local_5dc = 0;
  do {
    if (local_214 <= local_5dc) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&j);
      std::__cxx11::string::~string(local_450);
      std::ifstream::~ifstream(local_430);
      std::ifstream::~ifstream(local_210);
      return;
    }
    local_5e0 = 0;
    std::__cxx11::string::erase((ulong)local_450,0);
    while( true ) {
      plVar2 = (long *)std::istream::get(local_430);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
      if (!bVar1) break;
      if (local_215 < '!') {
        if ((local_215 == ' ') || (local_215 == '\n')) {
          if (local_5e0 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&Names_abi_cxx11_,(value_type *)local_450);
          }
          else if (local_5e0 == 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&Psws_abi_cxx11_,(value_type *)local_450);
          }
          local_5e0 = local_5e0 + 1;
          if (1 < local_5e0) break;
          std::__cxx11::string::erase((ulong)local_450,0);
          std::ios::clear((long)&j + *(long *)(_j + -0x18),0);
        }
      }
      else {
        std::__cxx11::string::operator+=(local_450,local_215);
      }
    }
    local_5dc = local_5dc + 1;
  } while( true );
}

Assistant:

void iniVIP() {
    ifstream test("VIPlist.txt");
    int num;
    char a;
    while(test.get(a)){
        if(a == '\n'){
            num++;
        }
    }

    ifstream fin("VIPlist.txt");
    string s;
    stringstream ss;
    int i , j;
    for (i = 0; i < num; i++) {//ϣ��.size���û�������
        j = 0;
        s.erase();
        while (fin.get(a)) {
            if (a > 32) {
                s += a;
            } else if (a == ' ' || a == '\n') {
                switch (j){
                    case 0:
                        Names.push_back(s);
                        break;
                    case 1:
                        Psws.push_back(s);
                }
                j++;
                if(j > 1){
                    break;
                }

                s.erase();
                ss.clear();
            }
        }
    }
    fin.close();
}